

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_thread.cc
# Opt level: O1

void __thiscall rtc::PlatformThread::Run(PlatformThread *this)

{
  bool bVar1;
  
  if ((this->name_)._M_string_length != 0) {
    prctl(0xf);
  }
  do {
    bVar1 = (*this->run_function_)(this->obj_);
    if (!bVar1) {
      return;
    }
    bVar1 = Event::Wait(&this->stop_event_,0);
  } while (!bVar1);
  return;
}

Assistant:

void PlatformThread::Run() {
  if (!name_.empty())
    rtc::SetCurrentThreadName(name_.c_str());
  do {
    // The interface contract of Start/Stop is that for a successful call to
    // Start, there should be at least one call to the run function.  So we
    // call the function before checking |stop_|.
    if (!run_function_(obj_))
      break;
#if defined(WEBRTC_WIN)
    // Alertable sleep to permit RaiseFlag to run and update |stop_|.
    SleepEx(0, true);
  } while (!stop_);
#else
  }